

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int i_1;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint _w;
  uint uVar15;
  int q_1;
  uint uVar16;
  int q;
  float fVar17;
  Mat sums;
  Mat local_90;
  ulong local_50;
  Mat *local_48;
  size_t local_40;
  void *local_38;
  
  sVar1 = a->elemsize;
  iVar14 = a->dims;
  if (iVar14 == 3) {
    uVar13 = a->w;
    lVar11 = (long)(int)uVar13;
    uVar16 = a->h;
    _w = a->c;
    uVar7 = (ulong)_w;
    uVar15 = uVar16 * uVar13;
    bVar3 = !reduce_h;
    if ((!reduce_w || bVar3) || !reduce_c) {
      if ((reduce_w && !bVar3) && !reduce_c) {
        Mat::create(b,_w,sVar1,opt->blob_allocator);
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)_w < 1) {
          uVar7 = 0;
        }
        for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
          Mat::channel(&sums,a,(int)uVar6);
          pvVar4 = sums.data;
          Mat::~Mat(&sums);
          fVar17 = 0.0;
          for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar4 + uVar9 * 4);
          }
          *(float *)((long)b->data + uVar6 * 4) = fVar17;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar16,_w,sVar1,opt->blob_allocator);
        uVar7 = 0;
        if (0 < (int)uVar13) {
          uVar7 = (ulong)uVar13;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        local_48 = a;
        for (uVar13 = 0; uVar13 != _w; uVar13 = uVar13 + 1) {
          Mat::channel(&sums,local_48,uVar13);
          pvVar10 = sums.data;
          Mat::~Mat(&sums);
          iVar14 = b->w;
          sVar1 = b->elemsize;
          pvVar4 = b->data;
          for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
            fVar17 = 0.0;
            for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
              fVar17 = fVar17 + *(float *)((long)pvVar10 + uVar9 * 4);
            }
            *(float *)((long)pvVar4 + uVar6 * 4 + (long)(int)uVar13 * (long)iVar14 * sVar1) = fVar17
            ;
            pvVar10 = (void *)((long)pvVar10 + lVar11 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,uVar16,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar16,_w,sVar1,opt->workspace_allocator);
        iVar14 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          local_48 = a;
          Mat::fill(&sums,0.0);
          uVar9 = 0;
          uVar6 = 0;
          if (0 < (int)uVar13) {
            uVar6 = (ulong)uVar13;
          }
          uVar12 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar12 = uVar9;
          }
          if ((int)_w < 1) {
            uVar7 = uVar9;
          }
          while (uVar9 != uVar7) {
            Mat::channel(&local_90,local_48,(int)uVar9);
            pvVar4 = local_90.data;
            Mat::~Mat(&local_90);
            pvVar10 = (void *)(sums.cstep * uVar9 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            local_90.data = pvVar10;
            local_50 = uVar9;
            Mat::~Mat(&local_90);
            for (uVar9 = 0; uVar9 != uVar12; uVar9 = uVar9 + 1) {
              fVar17 = 0.0;
              for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                fVar17 = fVar17 + *(float *)((long)pvVar4 + uVar8 * 4);
              }
              *(float *)((long)pvVar10 + uVar9 * 4) = fVar17;
              pvVar4 = (void *)((long)pvVar4 + lVar11 * 4);
            }
            uVar9 = local_50 + 1;
          }
          Mat::fill(b,0.0);
          for (uVar6 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar4 = sums.data, iVar14 = 0,
              uVar6 != uVar7; uVar6 = uVar6 + 1) {
            local_90.data = (void *)(sums.cstep * uVar6 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            pvVar10 = b->data;
            for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
              *(float *)((long)pvVar10 + uVar9 * 4) =
                   *(float *)((long)pvVar4 + uVar9 * 4 + sVar2 * sVar1 * uVar6) +
                   *(float *)((long)pvVar10 + uVar9 * 4);
            }
          }
        }
      }
      else {
        if ((bVar3 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar13,uVar16,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            if ((int)uVar15 < 1) {
              uVar15 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar13 = 0; uVar13 != _w; uVar13 = uVar13 + 1) {
              Mat::channel(&sums,a,uVar13);
              pvVar10 = sums.data;
              Mat::~Mat(&sums);
              pvVar4 = b->data;
              for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar4 + uVar7 * 4) =
                     *(float *)((long)pvVar10 + uVar7 * 4) + *(float *)((long)pvVar4 + uVar7 * 4);
              }
            }
            return 0;
          }
          if ((!bVar3 && !reduce_w) && !reduce_c) {
            Mat::create(b,uVar13,_w,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar7 = 0;
            if (0 < (int)uVar13) {
              uVar7 = (ulong)uVar13;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar13 = 0; uVar13 != _w; uVar13 = uVar13 + 1) {
              Mat::channel(&sums,a,uVar13);
              pvVar10 = sums.data;
              Mat::~Mat(&sums);
              lVar5 = (long)(int)(b->w * uVar13) * b->elemsize;
              pvVar4 = b->data;
              for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
                for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                  *(float *)((long)pvVar4 + uVar6 * 4 + lVar5) =
                       *(float *)((long)pvVar10 + uVar6 * 4) +
                       *(float *)((long)pvVar4 + uVar6 * 4 + lVar5);
                }
                pvVar10 = (void *)((long)pvVar10 + lVar11 * 4);
              }
            }
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar13,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar13,1,_w,sVar1,opt->workspace_allocator);
        iVar14 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar6 = 0;
          uVar9 = 0;
          if (0 < (int)uVar13) {
            uVar9 = (ulong)uVar13;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          if ((int)_w < 1) {
            uVar7 = uVar6;
          }
          while (uVar6 != uVar7) {
            local_50 = uVar6;
            Mat::channel(&local_90,a,(int)uVar6);
            pvVar4 = local_90.data;
            Mat::~Mat(&local_90);
            sVar1 = sums.cstep;
            local_38 = sums.data;
            local_40 = sums.elemsize;
            local_90.data = (void *)(sums.cstep * local_50 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            lVar5 = sVar1 * local_40 * local_50;
            for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
              for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)local_38 + uVar6 * 4 + lVar5) =
                     *(float *)((long)pvVar4 + uVar6 * 4) +
                     *(float *)((long)local_38 + uVar6 * 4 + lVar5);
              }
              pvVar4 = (void *)((long)pvVar4 + lVar11 * 4);
            }
            uVar6 = local_50 + 1;
          }
          Mat::fill(b,0.0);
          for (uVar6 = 0; sVar2 = sums.cstep, sVar1 = sums.elemsize, pvVar4 = sums.data, iVar14 = 0,
              uVar6 != uVar7; uVar6 = uVar6 + 1) {
            local_90.data = (void *)(sums.cstep * uVar6 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            pvVar10 = b->data;
            for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
              *(float *)((long)pvVar10 + uVar12 * 4) =
                   *(float *)((long)pvVar4 + uVar12 * 4 + sVar2 * sVar1 * uVar6) +
                   *(float *)((long)pvVar10 + uVar12 * 4);
            }
          }
        }
      }
      goto LAB_00139f44;
    }
    Mat::create(b,1,sVar1,opt->blob_allocator);
    Mat::Mat(&sums,_w,sVar1,opt->workspace_allocator);
    iVar14 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_00139f44;
    uVar9 = 0;
    uVar6 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar6 = uVar9;
    }
    if ((int)_w < 1) {
      uVar7 = uVar9;
    }
    for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      Mat::channel(&local_90,a,(int)uVar9);
      pvVar4 = local_90.data;
      Mat::~Mat(&local_90);
      fVar17 = 0.0;
      for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        fVar17 = fVar17 + *(float *)((long)pvVar4 + uVar12 * 4);
      }
      *(float *)((long)sums.data + uVar9 * 4) = fVar17;
    }
    fVar17 = 0.0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar17 = fVar17 + *(float *)((long)sums.data + uVar6 * 4);
    }
  }
  else {
    if (iVar14 != 2) {
      if (iVar14 == 1) {
        uVar13 = a->w;
        Mat::create(b,1,sVar1,opt->blob_allocator);
        uVar6 = 0;
        uVar7 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar7 = uVar6;
        }
        fVar17 = 0.0;
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          fVar17 = fVar17 + *(float *)((long)a->data + uVar6 * 4);
        }
        *(float *)b->data = fVar17;
        return 0;
      }
      return 0;
    }
    uVar13 = a->w;
    uVar16 = a->h;
    if (!reduce_w || !reduce_h) {
      if (reduce_w && !reduce_h) {
        Mat::create(b,uVar16,sVar1,opt->blob_allocator);
        pvVar4 = a->data;
        uVar7 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar7 = 0;
        }
        iVar14 = a->w;
        uVar6 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar6 = 0;
        }
        pvVar10 = b->data;
        sVar1 = a->elemsize;
        for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
          fVar17 = 0.0;
          for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
            fVar17 = fVar17 + *(float *)((long)pvVar4 + uVar12 * 4);
          }
          *(float *)((long)pvVar10 + uVar9 * 4) = fVar17;
          pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar1);
        }
        return 0;
      }
      if (reduce_h && !reduce_w) {
        Mat::create(b,uVar13,sVar1,opt->blob_allocator);
        Mat::fill(b,0.0);
        uVar7 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar7 = 0;
        }
        pvVar4 = a->data;
        uVar6 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar6 = 0;
        }
        iVar14 = a->w;
        sVar1 = a->elemsize;
        for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
          pvVar10 = b->data;
          for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar10 + uVar12 * 4) =
                 *(float *)((long)pvVar4 + uVar12 * 4) + *(float *)((long)pvVar10 + uVar12 * 4);
          }
          pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar1);
        }
        return 0;
      }
      return 0;
    }
    Mat::create(b,1,sVar1,opt->blob_allocator);
    Mat::Mat(&sums,uVar16,sVar1,opt->workspace_allocator);
    iVar14 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_00139f44;
    pvVar4 = a->data;
    iVar14 = a->w;
    uVar6 = 0;
    uVar7 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar7 = uVar6;
    }
    uVar9 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar9 = uVar6;
    }
    sVar1 = a->elemsize;
    for (; fVar17 = 0.0, uVar6 != uVar9; uVar6 = uVar6 + 1) {
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        fVar17 = fVar17 + *(float *)((long)pvVar4 + uVar12 * 4);
      }
      *(float *)((long)sums.data + uVar6 * 4) = fVar17;
      pvVar4 = (void *)((long)pvVar4 + (long)iVar14 * sVar1);
    }
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      fVar17 = fVar17 + *(float *)((long)sums.data + uVar7 * 4);
    }
  }
  *(float *)b->data = fVar17;
  iVar14 = 0;
LAB_00139f44:
  Mat::~Mat(&sums);
  return iVar14;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}